

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O0

double currentPosition(void)

{
  time_t tVar1;
  double timeDelta;
  
  if (currentlyPlaying) {
    if (0.0 <= s_currentPosition) {
      tVar1 = time((time_t *)0x0);
      timeDelta = round(((double)tVar1 - s_lastPositionFetched) + s_currentPosition);
    }
    else {
      timeDelta = -1.0;
    }
  }
  else {
    timeDelta = s_currentPosition;
  }
  return timeDelta;
}

Assistant:

static double currentPosition()
{
    if (!currentlyPlaying) {
        return s_currentPosition;
    }

    if (s_currentPosition < 0) {
        return -1;
    }
    double timeDelta = time(nullptr) - s_lastPositionFetched;
    return std::round(timeDelta + s_currentPosition);
}